

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CLogExp *exp)

{
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  char local_20 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: clogexp\n",0x15);
  TypeInfo::TypeInfo((TypeInfo *)local_38,BOOLEAN);
  (this->lastCalculatedType).isPrimitive = (bool)local_38[0];
  *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_38._1_3_;
  (this->lastCalculatedType).type = local_38._4_4_;
  std::__cxx11::string::operator=
            ((string *)&(this->lastCalculatedType).className,(string *)&local_30);
  if (local_30._M_p != local_20) {
    operator_delete(local_30._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CLogExp &exp ) 
{
    std::cout << "typechecker: clogexp\n";
    lastCalculatedType = enums::TPrimitiveType::BOOLEAN;
}